

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool __thiscall
ON_RTree::InsertRectRec
          (ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode *a_node,
          ON_RTreeNode **a_newNode,int a_level)

{
  double *pdVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ON_RTreeBBox *pOVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ON_RTreeNode *otherNode;
  ON_RTreeBranch local_a8;
  double local_70;
  ON_RTreeNode **local_68;
  ON__INT_PTR local_60;
  ON_RTree *local_58;
  ON_RTreeNode *local_50;
  double local_48;
  double local_40;
  ON_RTreeNode *local_38;
  
  if (a_level < a_node->m_level) {
    iVar2 = a_node->m_count;
    local_68 = a_newNode;
    local_60 = a_id;
    local_58 = this;
    local_50 = a_node;
    if ((long)iVar2 < 1) {
      uVar7 = 0xffffffff;
    }
    else {
      pOVar6 = &a_node->m_branch[0].m_rect;
      dVar12 = -1.0;
      uVar8 = 0xffffffff;
      bVar3 = true;
      uVar5 = 0;
      dVar9 = -1.0;
      do {
        dVar10 = pOVar6->m_max[0] - pOVar6->m_min[0];
        dVar13 = pOVar6->m_max[1] - pOVar6->m_min[1];
        dVar11 = pOVar6->m_max[2] - pOVar6->m_min[2];
        local_48 = dVar11 * dVar11 + dVar13 * dVar13 + dVar10 * dVar10;
        local_70 = dVar12;
        local_40 = dVar9;
        CombineRectHelper(&local_a8.m_rect,a_rect,pOVar6);
        dVar10 = ((local_a8.m_rect.m_max[2] - local_a8.m_rect.m_min[2]) *
                  (local_a8.m_rect.m_max[2] - local_a8.m_rect.m_min[2]) +
                 (local_a8.m_rect.m_max[1] - local_a8.m_rect.m_min[1]) *
                 (local_a8.m_rect.m_max[1] - local_a8.m_rect.m_min[1]) +
                 (local_a8.m_rect.m_max[0] - local_a8.m_rect.m_min[0]) *
                 (local_a8.m_rect.m_max[0] - local_a8.m_rect.m_min[0])) - local_48;
        if ((dVar10 < local_40) || (bVar3)) {
          bVar3 = false;
LAB_005b27d9:
          uVar8 = uVar5 & 0xffffffff;
          dVar9 = dVar10;
          dVar12 = local_48;
        }
        else {
          dVar9 = local_40;
          dVar12 = local_70;
          if (((dVar10 == local_40) && (!NAN(dVar10) && !NAN(local_40))) && (local_48 <= local_70))
          goto LAB_005b27d9;
        }
        uVar7 = (uint)uVar8;
        uVar5 = uVar5 + 1;
        pOVar6 = (ON_RTreeBBox *)(pOVar6[1].m_min + 1);
      } while ((long)iVar2 != uVar5);
    }
    a_node = local_50;
    this = local_58;
    if (-1 < (int)uVar7) {
      pOVar6 = &local_50->m_branch[uVar7].m_rect;
      bVar3 = InsertRectRec(local_58,a_rect,local_60,local_50->m_branch[uVar7].field_1.m_child,
                            &local_38,a_level);
      if (bVar3) {
        NodeCover(&local_a8.m_rect,a_node->m_branch[uVar7].field_1.m_child);
        a_node->m_branch[uVar7].m_rect.m_max[1] = local_a8.m_rect.m_max[1];
        a_node->m_branch[uVar7].m_rect.m_max[2] = local_a8.m_rect.m_max[2];
        a_node->m_branch[uVar7].m_rect.m_min[2] = local_a8.m_rect.m_min[2];
        a_node->m_branch[uVar7].m_rect.m_max[0] = local_a8.m_rect.m_max[0];
        pOVar6->m_min[0] = local_a8.m_rect.m_min[0];
        a_node->m_branch[uVar7].m_rect.m_min[1] = local_a8.m_rect.m_min[1];
        local_a8.field_1.m_child = local_38;
        NodeCover(&local_a8.m_rect,local_38);
        lVar4 = (long)a_node->m_count;
        bVar3 = 5 < lVar4;
        a_newNode = local_68;
        if (lVar4 < 6) {
          a_node->m_branch[lVar4].field_1.m_child = (ON_RTreeNode *)local_a8.field_1;
          pdVar1 = a_node->m_branch[lVar4].m_rect.m_max + 1;
          *pdVar1 = local_a8.m_rect.m_max[1];
          pdVar1[1] = local_a8.m_rect.m_max[2];
          pdVar1 = a_node->m_branch[lVar4].m_rect.m_min + 2;
          *pdVar1 = local_a8.m_rect.m_min[2];
          pdVar1[1] = local_a8.m_rect.m_max[0];
          a_node->m_branch[lVar4].m_rect.m_min[0] = local_a8.m_rect.m_min[0];
          a_node->m_branch[lVar4].m_rect.m_min[1] = local_a8.m_rect.m_min[1];
          a_node->m_count = a_node->m_count + 1;
          return bVar3;
        }
        goto LAB_005b294a;
      }
      CombineRectHelper(&local_a8.m_rect,a_rect,pOVar6);
      a_node->m_branch[uVar7].m_rect.m_max[1] = local_a8.m_rect.m_max[1];
      a_node->m_branch[uVar7].m_rect.m_max[2] = local_a8.m_rect.m_max[2];
      a_node->m_branch[uVar7].m_rect.m_min[2] = local_a8.m_rect.m_min[2];
      a_node->m_branch[uVar7].m_rect.m_max[0] = local_a8.m_rect.m_max[0];
      pOVar6->m_min[0] = local_a8.m_rect.m_min[0];
      a_node->m_branch[uVar7].m_rect.m_min[1] = local_a8.m_rect.m_min[1];
    }
    bVar3 = false;
  }
  else {
    if (a_node->m_level != a_level) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0xb03,"","ON_RTree::InsertRectRec - bug in algorithm");
      return false;
    }
    local_a8.m_rect.m_min[0] = a_rect->m_min[0];
    local_a8.m_rect.m_min[1] = a_rect->m_min[1];
    local_a8.m_rect.m_min[2] = a_rect->m_min[2];
    local_a8.m_rect.m_max[0] = a_rect->m_max[0];
    local_a8.m_rect.m_max[1] = a_rect->m_max[1];
    local_a8.m_rect.m_max[2] = a_rect->m_max[2];
    lVar4 = (long)a_node->m_count;
    bVar3 = 5 < lVar4;
    local_a8.field_1.m_id = a_id;
    if (lVar4 < 6) {
      a_node->m_branch[lVar4].field_1.m_id = a_id;
      pdVar1 = a_node->m_branch[lVar4].m_rect.m_max + 1;
      *pdVar1 = local_a8.m_rect.m_max[1];
      pdVar1[1] = local_a8.m_rect.m_max[2];
      pdVar1 = a_node->m_branch[lVar4].m_rect.m_min + 2;
      *pdVar1 = local_a8.m_rect.m_min[2];
      pdVar1[1] = local_a8.m_rect.m_max[0];
      a_node->m_branch[lVar4].m_rect.m_min[0] = local_a8.m_rect.m_min[0];
      a_node->m_branch[lVar4].m_rect.m_min[1] = local_a8.m_rect.m_min[1];
      a_node->m_count = a_node->m_count + 1;
      return bVar3;
    }
LAB_005b294a:
    SplitNode(this,a_node,&local_a8,a_newNode);
  }
  return bVar3;
}

Assistant:

bool ON_RTree::InsertRectRec(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode* a_node, ON_RTreeNode** a_newNode, int a_level)
{
  int index;
  ON_RTreeBranch branch;
  ON_RTreeNode* otherNode;

  // Still above level for insertion, go down tree recursively
  if(a_node->m_level > a_level)
  {
    index = PickBranch(a_rect, a_node);
    if ( index < 0 )
    {
      return false;
    }
    if (!InsertRectRec(a_rect, a_id, a_node->m_branch[index].m_child, &otherNode, a_level))
    {
      // Child was not split
      a_node->m_branch[index].m_rect = CombineRectHelper(a_rect, &(a_node->m_branch[index].m_rect));
      return false;
    }
    else // Child was split
    {
      a_node->m_branch[index].m_rect = NodeCover(a_node->m_branch[index].m_child);
      branch.m_child = otherNode;
      branch.m_rect = NodeCover(otherNode);
      return AddBranch(&branch, a_node, a_newNode);
    }
  }
  else if(a_node->m_level == a_level) // Have reached level for insertion. Add rect, split if necessary
  {
    branch.m_rect = *a_rect;

    // The (ON_RTreeNode*) cast is safe because ON__INT_PTR == sizeof(void*)
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_PUSH
// Disable warning C4312: 'type cast' : conversion from 'ON__INT_PTR' to 'ON_RTreeNode *' of greater size
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4312 )
#endif
    branch.m_child = (ON_RTreeNode*)a_id;
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_POP
#endif

    // Child field of leaves contains id of data record
    return AddBranch(&branch, a_node, a_newNode);
  }

  // We should never get here
  ON_ERROR("ON_RTree::InsertRectRec - bug in algorithm");
  return false;
}